

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdiskcache.cpp
# Opt level: O3

qint64 __thiscall QNetworkDiskCache::expire(QNetworkDiskCache *this)

{
  undefined8 *puVar1;
  long lVar2;
  QArrayData *pQVar3;
  long lVar4;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar5;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar6;
  char cVar7;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar8;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar13;
  __normal_iterator<CacheItem_*,_std::vector<CacheItem,_std::allocator<CacheItem>_>_> __i;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar14;
  long lVar15;
  QNetworkDiskCachePrivate *d;
  ulong uVar16;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar17;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *pQVar18;
  long in_FS_OFFSET;
  QLatin1String QVar19;
  QDateTime fileTime;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *local_a8;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *local_a0;
  QNetworkCacheMetaData local_88;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_80;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> QStack_78;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_70;
  totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> tStack_68;
  Data local_60;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> local_58;
  QTimeZone local_50;
  DirEntry local_48;
  QDirListing local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  lVar15 = *(long *)(lVar2 + 0xd0);
  if ((-1 < lVar15) && (lVar15 < *(long *)(lVar2 + 200))) goto LAB_001d5bb5;
  pQVar3 = *(QArrayData **)(lVar2 + 0x98);
  lVar15 = *(long *)(lVar2 + 0xa8);
  if (pQVar3 != (QArrayData *)0x0) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar3,2,0x10);
    }
  }
  if (lVar15 == 0) {
    expire();
    lVar15 = 0;
    goto LAB_001d5bb5;
  }
  QNetworkCacheMetaData::QNetworkCacheMetaData(&local_88);
  QVar8.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                ((totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar2 + 0x78))->ptr;
  ((QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)(lVar2 + 0x78))->d =
       (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
  local_88.d.d.ptr =
       (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
       (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar8.d.ptr;
  QNetworkCacheMetaData::~QNetworkCacheMetaData(&local_88);
  QBuffer::close();
  if (*(long **)(lVar2 + 0x90) != (long *)0x0) {
    (**(code **)(**(long **)(lVar2 + 0x90) + 0x20))();
  }
  *(undefined8 *)(lVar2 + 0x90) = 0;
  lVar2 = *(long *)(this + 8);
  local_88.d.d.ptr =
       (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
       ((totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar2 + 0x98))->ptr;
  local_80.d.ptr = *(totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar2 + 0xa0);
  QStack_78.d.ptr = *(totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*> *)(lVar2 + 0xa8);
  if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
    LOCK();
    *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + 1;
    UNLOCK();
  }
  QDirListing::QDirListing(local_40,&local_88,0x418);
  if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
    LOCK();
    *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
    UNLOCK();
    if (*(int *)local_88.d.d.ptr == 0) {
      QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,2,0x10);
    }
  }
  local_48.dirListPtr = (QDirListingPrivate *)QDirListing::begin();
  if (local_48.dirListPtr == (QDirListingPrivate *)0x0) {
    local_a0 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    pQVar17 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    local_a8 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    lVar15 = 0;
  }
  else {
    lVar15 = 0;
    pQVar17 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    local_a0 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    pQVar13 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0;
    do {
      QDirListing::DirEntry::fileName();
      QVar19.m_data = (char *)0x2;
      QVar19.m_size = (qsizetype)&local_88;
      cVar7 = QString::endsWith(QVar19,0x2640aa);
      if (local_88.d.d.ptr != (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0) {
        LOCK();
        *(int *)local_88.d.d.ptr = *(int *)local_88.d.d.ptr + -1;
        UNLOCK();
        if (*(int *)local_88.d.d.ptr == 0) {
          QArrayData::deallocate((QArrayData *)local_88.d.d.ptr,2,0x10);
        }
      }
      local_a8 = pQVar13;
      if (cVar7 != '\0') {
        QDirListing::DirEntry::fileInfo();
        local_58.d.ptr =
             (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
        local_88.d.d.ptr =
             (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
             (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x2;
        QFileInfo::fileTime((FileTime)&local_58,&local_50);
        QTimeZone::~QTimeZone((QTimeZone *)&local_88);
        cVar7 = QDateTime::isValid();
        if (cVar7 == '\0') {
          local_60 = (Data)0x2;
          QFileInfo::fileTime((FileTime)(QDateTime *)&local_88,&local_50);
          QVar8.d.ptr = local_58.d.ptr;
          local_58.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
          local_88.d.d.ptr =
               (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
               (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar8.d.ptr;
          QDateTime::~QDateTime((QDateTime *)&local_88);
          QTimeZone::~QTimeZone((QTimeZone *)&local_60.s);
        }
        QVar8.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                      QDateTime::toMSecsSinceEpoch();
        QVar9.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)QFileInfo::size();
        local_88.d.d.ptr =
             (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)
             (QSharedDataPointer<QNetworkCacheMetaDataPrivate>)QVar8.d.ptr;
        QFileInfo::filePath();
        QVar6.d.ptr = local_70.d.ptr;
        QVar5.d.ptr = QStack_78.d.ptr;
        QVar8.d.ptr = local_80.d.ptr;
        tStack_68.ptr = (QNetworkCacheMetaDataPrivate *)QVar9.d.ptr;
        if (pQVar17 == local_a0) {
          uVar12 = (long)pQVar17 - (long)pQVar13;
          if (uVar12 == 0x7ffffffffffffff8) goto LAB_001d5be6;
          uVar10 = ((long)uVar12 >> 3) * -0x3333333333333333;
          uVar11 = uVar10;
          if (pQVar17 == pQVar13) {
            uVar11 = 1;
          }
          uVar16 = uVar11 + uVar10;
          if (0x333333333333332 < uVar16) {
            uVar16 = 0x333333333333333;
          }
          if (CARRY8(uVar11,uVar10)) {
            uVar16 = 0x333333333333333;
          }
          local_a8 = (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)operator_new(uVar16 * 0x28)
          ;
          QVar6.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                        (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_70;
          QVar5.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                        (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)QStack_78;
          QVar8.d.ptr = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
                        (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_80;
          ((QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)((long)local_a8 + uVar12))->d =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
          local_80.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          QStack_78.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          puVar1 = (undefined8 *)((long)local_a8 + uVar12 + 8);
          *puVar1 = QVar8.d.ptr;
          puVar1[1] = QVar5.d.ptr;
          local_70.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          puVar1 = (undefined8 *)((long)local_a8 + uVar12 + 0x18);
          *puVar1 = QVar6.d.ptr;
          puVar1[1] = tStack_68.ptr;
          pQVar18 = local_a8;
          for (pQVar14 = pQVar13; pQVar17 != pQVar14; pQVar14 = pQVar14 + 5) {
            pQVar18->d = (QNetworkCacheMetaDataPrivate *)pQVar14->d;
            QVar8.d.ptr = pQVar14[1].d;
            QVar5.d.ptr = pQVar14[2].d;
            pQVar14[1].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
            pQVar14[2].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
            pQVar18[1].d = QVar8.d.ptr;
            pQVar18[2].d = QVar5.d.ptr;
            QVar8.d.ptr = pQVar14[3].d;
            QVar5.d.ptr = pQVar14[4].d;
            pQVar14[3].d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)0x0;
            pQVar18[3].d = QVar8.d.ptr;
            pQVar18[4].d = QVar5.d.ptr;
            pQVar18 = pQVar18 + 5;
          }
          if (pQVar13 != (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0) {
            operator_delete(pQVar13,uVar12);
          }
          local_a0 = local_a8 + uVar16 * 5;
        }
        else {
          pQVar17->d = (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)local_88.d.d.ptr;
          local_80.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          pQVar17[1].d = QVar8.d.ptr;
          QStack_78.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          pQVar17[2].d = QVar5.d.ptr;
          local_70.d.ptr =
               (totally_ordered_wrapper<QNetworkCacheMetaDataPrivate_*>)
               (QNetworkCacheMetaDataPrivate *)0x0;
          pQVar17[3].d = QVar6.d.ptr;
          pQVar17[4].d = QVar9.d.ptr;
          pQVar18 = pQVar17;
        }
        pQVar17 = pQVar18 + 5;
        if (local_a8 == pQVar17) {
          expire();
LAB_001d5be6:
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        if (local_80.d.ptr != (QNetworkCacheMetaDataPrivate *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_80.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_80.d.ptr,2,0x10);
          }
        }
        lVar15 = lVar15 + (long)QVar9.d.ptr;
        QDateTime::~QDateTime((QDateTime *)&local_58);
        QFileInfo::~QFileInfo((QFileInfo *)&local_50);
      }
      local_48.dirListPtr = (QDirListingPrivate *)QDirListing::next(local_48);
      pQVar13 = local_a8;
    } while (local_48.dirListPtr != (QDirListingPrivate *)0x0);
  }
  local_48.dirListPtr = (QDirListingPrivate *)0x0;
  QDirListing::~QDirListing(local_40);
  lVar2 = (*(long *)(*(long *)(this + 8) + 200) * 9) / 10;
  pQVar13 = local_a8;
  if ((lVar2 <= lVar15) && (local_a8 != pQVar17)) {
    uVar12 = ((long)pQVar17 - (long)local_a8 >> 3) * -0x3333333333333333;
    lVar4 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
              (local_a8,pQVar17,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
    pQVar18 = local_a8;
    if ((long)pQVar17 - (long)local_a8 < 0x281) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                (local_a8,pQVar17);
    }
    else {
      pQVar14 = local_a8 + 0x50;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Iter_comp_iter<QNetworkDiskCache::expire()::__0>>
                (local_a8,pQVar14);
      if (pQVar14 != pQVar17) {
        do {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<QNetworkDiskCache::expire()::CacheItem*,std::vector<QNetworkDiskCache::expire()::CacheItem,std::allocator<QNetworkDiskCache::expire()::CacheItem>>>,__gnu_cxx::__ops::_Val_comp_iter<QNetworkDiskCache::expire()::__0>>
                    (pQVar14);
          pQVar14 = pQVar14 + 5;
        } while (pQVar14 != pQVar17);
        if (local_a8 == pQVar17) goto joined_r0x001d5b71;
      }
    }
    do {
      pQVar14 = pQVar18 + 5;
      QFile::remove((QString *)(pQVar18 + 1));
      lVar15 = lVar15 - (long)pQVar18[4].d;
      if (lVar15 < lVar2) break;
      pQVar18 = pQVar14;
    } while (pQVar14 != pQVar17);
  }
joined_r0x001d5b71:
  for (; pQVar13 != pQVar17; pQVar13 = pQVar13 + 5) {
    QVar8.d.ptr = pQVar13[1].d;
    if (QVar8.d.ptr != (QNetworkCacheMetaDataPrivate *)0x0) {
      LOCK();
      *(int *)QVar8.d.ptr = *(int *)QVar8.d.ptr + -1;
      UNLOCK();
      if (*(int *)QVar8.d.ptr == 0) {
        QArrayData::deallocate((QArrayData *)pQVar13[1].d,2,0x10);
      }
    }
  }
  if (local_a8 != (QSharedDataPointer<QNetworkCacheMetaDataPrivate> *)0x0) {
    operator_delete(local_a8,(long)local_a0 - (long)local_a8);
  }
LAB_001d5bb5:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return lVar15;
}

Assistant:

qint64 QNetworkDiskCache::expire()
{
    Q_D(QNetworkDiskCache);
    if (d->currentCacheSize >= 0 && d->currentCacheSize < maximumCacheSize())
        return d->currentCacheSize;

    if (cacheDirectory().isEmpty()) {
        qWarning("QNetworkDiskCache::expire() The cache directory is not set");
        return 0;
    }

    // close file handle to prevent "in use" error when QFile::remove() is called
    d->lastItem.reset();

    struct CacheItem
    {
        std::chrono::milliseconds msecs;
        QString path;
        qint64 size = 0;
    };
    std::vector<CacheItem> cacheItems;
    qint64 totalSize = 0;
    using F = QDirListing::IteratorFlag;
    for (const auto &dirEntry : QDirListing(cacheDirectory(), F::FilesOnly | F::Recursive)) {
        if (!dirEntry.fileName().endsWith(CACHE_POSTFIX))
            continue;

        const QFileInfo &info = dirEntry.fileInfo();
        QDateTime fileTime = info.birthTime(QTimeZone::UTC);
        if (!fileTime.isValid())
            fileTime = info.metadataChangeTime(QTimeZone::UTC);
        const std::chrono::milliseconds msecs{fileTime.toMSecsSinceEpoch()};
        const qint64 size = info.size();
        cacheItems.push_back(CacheItem{msecs, info.filePath(), size});
        totalSize += size;
    }

    const qint64 goal = (maximumCacheSize() * 9) / 10;
    if (totalSize < goal)
        return totalSize; // Nothing to do

    auto byFileTime = [&](const auto &a, const auto &b) { return a.msecs < b.msecs; };
    std::sort(cacheItems.begin(), cacheItems.end(), byFileTime);

    [[maybe_unused]] int removedFiles = 0; // used under QNETWORKDISKCACHE_DEBUG
    for (const CacheItem &cached : cacheItems) {
        QFile::remove(cached.path);
        ++removedFiles;
        totalSize -= cached.size;
        if (totalSize < goal)
            break;
    }
#if defined(QNETWORKDISKCACHE_DEBUG)
    if (removedFiles > 0) {
        qDebug() << "QNetworkDiskCache::expire()"
                << "Removed:" << removedFiles
                << "Kept:" << cacheItems.count() - removedFiles;
    }
#endif
    return totalSize;
}